

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableNT.cpp
# Opt level: O1

size_t __thiscall adios2::VariableNT::StructFields(VariableNT *this)

{
  VariableBase *pointer;
  long *plVar1;
  size_t sVar2;
  long *plVar3;
  size_type *psVar4;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  string local_50;
  
  pointer = this->m_Variable;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"in call to VariableNT::StructFields","");
  helper::CheckForNullptr<adios2::core::VariableBase>(pointer,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (*(int *)(this->m_Variable + 0x28) != 0x10) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"bindings::CXX11","");
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"VariableNT","");
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"StructFields","");
    adios2::ToString_abi_cxx11_((DataType)local_70);
    plVar1 = (long *)std::__cxx11::string::replace((ulong)local_70,0,(char *)0x0,0x1e64d5);
    plVar3 = plVar1 + 2;
    if ((long *)*plVar1 == plVar3) {
      local_100 = *plVar3;
      lStack_f8 = plVar1[3];
      local_110 = &local_100;
    }
    else {
      local_100 = *plVar3;
      local_110 = (long *)*plVar1;
    }
    local_108 = plVar1[1];
    *plVar1 = (long)plVar3;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_110);
    psVar4 = (size_type *)(plVar1 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar1 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar4) {
      local_f0.field_2._M_allocated_capacity = *psVar4;
      local_f0.field_2._8_8_ = plVar1[3];
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    }
    else {
      local_f0.field_2._M_allocated_capacity = *psVar4;
      local_f0._M_dataplus._M_p = (pointer)*plVar1;
    }
    local_f0._M_string_length = plVar1[1];
    *plVar1 = (long)psVar4;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    helper::Throw<std::runtime_error>(&local_90,&local_b0,&local_d0,&local_f0,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110);
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
  }
  sVar2 = adios2::core::StructDefinition::Fields();
  return sVar2;
}

Assistant:

size_t VariableNT::StructFields() const
{
    helper::CheckForNullptr(m_Variable, "in call to VariableNT::StructFields");
    if (m_Variable->m_Type != DataType::Struct)
    {
        helper::Throw<std::runtime_error>("bindings::CXX11", "VariableNT", "StructFields",
                                          "invalid data type " + ToString(m_Variable->m_Type) +
                                              ", only Struct type supports this API");
    }
    if (reinterpret_cast<core::VariableStruct *>(m_Variable)->m_ReadStructDefinition)
        return reinterpret_cast<core::VariableStruct *>(m_Variable)
            ->m_ReadStructDefinition->Fields();
    else
        return reinterpret_cast<core::VariableStruct *>(m_Variable)
            ->m_WriteStructDefinition->Fields();
}